

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.cc
# Opt level: O2

void __thiscall serial::Serial::flushInput(Serial *this)

{
  ScopedReadLock lock;
  ScopedReadLock local_10;
  
  local_10.pimpl_ = this->pimpl_;
  SerialImpl::readLock(local_10.pimpl_);
  SerialImpl::flushInput(this->pimpl_);
  ScopedReadLock::~ScopedReadLock(&local_10);
  return;
}

Assistant:

void Serial::flushInput ()
{
  ScopedReadLock lock(this->pimpl_);
  pimpl_->flushInput ();
}